

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void nn_timer_init(nn_timer *self,int src,nn_fsm *owner)

{
  nn_worker *pnVar1;
  nn_fsm *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_fsm_init(&self->fsm,(nn_fsm_fn)CONCAT44(src,in_stack_00000008),(nn_fsm_fn)owner,
              (int)((ulong)in_RDI >> 0x20),(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX
             );
  *(undefined4 *)(in_RDI + 0x58) = 1;
  nn_worker_task_init((nn_worker_task *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                      (int)((ulong)in_RDX >> 0x20),(nn_fsm *)0x2fe0aa);
  nn_worker_task_init((nn_worker_task *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                      (int)((ulong)in_RDX >> 0x20),(nn_fsm *)0x2fe0c2);
  nn_worker_timer_init((nn_worker_timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  nn_fsm_event_init((nn_fsm_event *)0x2fe0e9);
  pnVar1 = nn_fsm_choose_worker((nn_fsm *)0x2fe0f3);
  *(nn_worker **)(in_RDI + 0xd8) = pnVar1;
  *(undefined4 *)(in_RDI + 0xe0) = 0xffffffff;
  return;
}

Assistant:

void nn_timer_init (struct nn_timer *self, int src, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_timer_handler, nn_timer_shutdown,
        src, self, owner);
    self->state = NN_TIMER_STATE_IDLE;
    nn_worker_task_init (&self->start_task, NN_TIMER_SRC_START_TASK,
        &self->fsm);
    nn_worker_task_init (&self->stop_task, NN_TIMER_SRC_STOP_TASK, &self->fsm);
    nn_worker_timer_init (&self->wtimer, &self->fsm);
    nn_fsm_event_init (&self->done);
    self->worker = nn_fsm_choose_worker (&self->fsm);
    self->timeout = -1;
}